

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O1

void __thiscall FParser::NextToken(FParser *this)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  byte *brace;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  DFsSection *pDVar7;
  tokentype_t tVar8;
  
  iVar3 = this->NumTokens;
  pcVar5 = this->Tokens[(long)iVar3 + -1];
  if ((*pcVar5 != '\0') || (this->TokenType[(long)iVar3 + -1] == string_)) {
    this->NumTokens = iVar3 + 1;
    sVar4 = strlen(pcVar5);
    this->Tokens[iVar3] = pcVar5 + sVar4 + 1;
    pcVar5[sVar4 + 1] = '\0';
  }
  cVar1 = *this->Rover;
  if ((cVar1 != '\0') &&
     (((cVar1 == ' ' || (cVar1 < ' ')) && (pcVar5 = this->Rover, *pcVar5 != '\0' && *pcVar5 < '!')))
     ) {
    do {
      pcVar5 = pcVar5 + 1;
      this->Rover = pcVar5;
      if (' ' < *pcVar5) break;
    } while (*pcVar5 != '\0');
  }
  brace = (byte *)this->Rover;
  if (*brace == 0) {
    if (*this->Tokens[0] == '\0') {
      return;
    }
    pcVar5 = "missing \';\'\n";
    goto LAB_00511a2b;
  }
  iVar3 = this->NumTokens;
  lVar6 = (long)iVar3;
  if ((*brace == 0x28 && 1 < lVar6) && (this->TokenType[iVar3 - 2U] == name_)) {
    this->TokenType[iVar3 - 2U] = function;
  }
  bVar2 = *brace;
  if (bVar2 < 0x7b) {
    if (bVar2 == 0x22) {
      this->TokenType[lVar6 + -1] = string_;
      if (this->TokenType[lVar6 + -2] == string_) {
        this->NumTokens = iVar3 + -1;
      }
      this->Rover = (char *)(brace + 1);
      return;
    }
    if (bVar2 == 0x3a) {
      this->NumTokens = 1;
      *this->Tokens[0] = '\0';
      this->TokenType[(long)this->NumTokens + -1] = name_;
      this->Rover = this->Rover + 1;
      return;
    }
LAB_00511996:
    if ((((bVar2 == 0x5f) || (0xfffffff5 < (int)(char)bVar2 - 0x3aU)) ||
        (tVar8 = operator_, 0xffffffe5 < ((int)(char)bVar2 & 0xffffffdfU) - 0x5b)) &&
       (tVar8 = number, 9 < (byte)(bVar2 - 0x30))) {
      tVar8 = (tokentype_t)(bVar2 == 0x2e);
    }
    this->TokenType[lVar6 + -1] = tVar8;
  }
  else {
    if (bVar2 == 0x7d) {
      this->BraceType = 1;
      pDVar7 = DFsScript::FindSectionEnd(this->Script,(char *)brace);
    }
    else {
      if (bVar2 != 0x7b) goto LAB_00511996;
      this->BraceType = 0;
      pDVar7 = DFsScript::FindSectionStart(this->Script,(char *)brace);
    }
    this->Section = pDVar7;
    if (pDVar7 == (DFsSection *)0x0) {
      pcVar5 = "section not found!\n";
LAB_00511a2b:
      script_error(pcVar5);
      return;
    }
  }
  return;
}

Assistant:

void FParser::NextToken()
{
	if(Tokens[NumTokens-1][0] || TokenType[NumTokens-1]==string_)
    {
		NumTokens++;
		Tokens[NumTokens-1] = Tokens[NumTokens-2] + strlen(Tokens[NumTokens-2]) + 1;
		Tokens[NumTokens-1][0] = 0;
    }
	
	// get to the next token, ignoring spaces, newlines,
	// useless chars, comments etc
	
	while(1)
    {
		// empty whitespace
		if(*Rover && (*Rover==' ' || *Rover<32))
		{
			while((*Rover==' ' || *Rover<32) && *Rover) Rover++;
		}
		// end-of-script?
		if(!*Rover)
		{
			if(Tokens[0][0])
			{
				// line contains text, but no semicolon: an error
				script_error("missing ';'\n");
			}
			// empty line, end of command-list
			return;
		}
		break;  // otherwise
    }
	
	if(NumTokens>1 && *Rover == '(' && TokenType[NumTokens-2] == name_)
		TokenType[NumTokens-2] = function;
	
	if(*Rover == '{' || *Rover == '}')
    {
		if(*Rover == '{')
		{
			BraceType = bracket_open;
			Section = Script->FindSectionStart(Rover);
		}
		else            // closing brace
		{
			BraceType = bracket_close;
			Section = Script->FindSectionEnd(Rover);
		}
		if(!Section)
		{
			script_error("section not found!\n");
			return;
		}
    }
	else if(*Rover == ':')  // label
    {
		// ignore the label : reset
		NumTokens = 1;
		Tokens[0][0] = 0; TokenType[NumTokens-1] = name_;
		Rover++;        // ignore
    }
	else if(*Rover == '\"')
    {
		TokenType[NumTokens-1] = string_;
		if(TokenType[NumTokens-2] == string_) NumTokens--;   // join strings
		Rover++;
    }
	else
    {
		TokenType[NumTokens-1] = isop(*Rover) ? operator_ : isnum(*Rover) ? number : name_;
    }
}